

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pz81_mod.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinPZ81_MOD>::eval_exc_vxc_unpolar_impl
               (double rho,double *eps,double *vrho)

{
  double *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double t130;
  double t127;
  double t116;
  double t112;
  double t110;
  double t108;
  double t107;
  double t99;
  double t95;
  double t93;
  double t89;
  double t88;
  double t86;
  double t84;
  double t83;
  double t81;
  double t80;
  double t79;
  double t74;
  double t72;
  double t70;
  double t67;
  double t51;
  double t42;
  double t34;
  double t28;
  double t24;
  double t21;
  double t15;
  double t12;
  double t11;
  double t10;
  double t9;
  double t8;
  double t7;
  double t63;
  double t59;
  double t58;
  double t54;
  double t48;
  double t44;
  double t43;
  double t38;
  double t33;
  double t32;
  double t27;
  double t20;
  double t19;
  double t14;
  double t13;
  double t6;
  double t76;
  double t5;
  double t3;
  double t1;
  
  dVar1 = safe_math::cbrt<double>(9.85438633912658e-318);
  dVar2 = (1.0 / dVar1) * 2.519842099789747;
  dVar3 = (double)(-(ulong)(1.0 <= dVar2 * 0.9847450218426962 * 0.25) & 0x3ff0000000000000);
  dVar4 = safe_math::sqrt<double>(9.85525589466326e-318);
  dVar5 = (1.0 / dVar1) * 1.720508027656199;
  dVar6 = (dVar4 * 1.0529) / 2.0 + 1.0 + (dVar5 * 0.4808460067404899) / 4.0;
  dVar7 = safe_math::log<double>(9.85590806131577e-318);
  dVar2 = dVar2 * dVar7;
  dVar8 = piecewise_functor_3<double>
                    (dVar3 != 0.0,-0.1423 / dVar6,
                     dVar7 * 0.0311 + -0.048 + (dVar2 * 0.001988349821872322) / 4.0 +
                     (dVar5 * -0.016776342736774526) / 4.0);
  dVar9 = (dVar4 * 1.3981) / 2.0 + 1.0 + (dVar5 * 0.37657136280726433) / 4.0;
  dVar5 = piecewise_functor_3<double>
                    (dVar3 != 0.0,-0.0843 / dVar9,
                     dVar7 * 0.01555 + -0.0269 + (dVar2 * 0.0006819863594880269) / 4.0 +
                     (dVar5 * -0.006924620274477757) / 4.0);
  dVar2 = safe_math::cbrt<double>(9.85814123803498e-318);
  dVar2 = piecewise_functor_3<double>(false,dVar2 * 1e-15,1.0);
  dVar2 = dVar2 + dVar2 + -2.0;
  dVar5 = (dVar5 - dVar8) * dVar2 * 1.9236610509315362;
  dVar1 = (1.0 / dVar1) / in_XMM0_Qa;
  dVar10 = dVar1 * 1.720508027656199;
  dVar7 = dVar1 * 2.519842099789747 * dVar7;
  dVar1 = piecewise_functor_3<double>
                    (dVar3 != 0.0,
                     -(-0.1423 / (dVar6 * dVar6)) *
                     ((dVar10 * -0.4808460067404899) / 12.0 -
                     ((1.0 / dVar4) * 1.0529 * 1.4422495703074083 * dVar10) / 12.0),
                     ((((1.0 / in_XMM0_Qa) * -0.0311) / 3.0 - (dVar7 * 0.001988349821872322) / 12.0)
                     - (dVar10 * 0.002912121018748603) / 12.0) -
                     (dVar10 * -0.016776342736774526) / 12.0);
  dVar3 = piecewise_functor_3<double>
                    (dVar3 != 0.0,
                     -(-0.0843 / (dVar9 * dVar9)) *
                     ((-((1.0 / dVar4) * 1.3981 * 1.4422495703074083) * dVar10) / 12.0 -
                     (dVar10 * 0.37657136280726433) / 12.0),
                     ((((1.0 / in_XMM0_Qa) * -0.01555) / 3.0 -
                      (dVar7 * 0.0006819863594880269) / 12.0) -
                     (dVar10 * 0.0009988316895337811) / 12.0) -
                     (dVar10 * -0.006924620274477757) / 12.0);
  *in_RDI = dVar8 + dVar5;
  *in_RSI = in_XMM0_Qa * (dVar1 + (dVar3 - dVar1) * dVar2 * 1.9236610509315362) + dVar8 + dVar5;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_unpolar_impl( double rho, double& eps, double& vrho ) {

    (void)(eps);
    constexpr double t1 = constants::m_cbrt_3;
    constexpr double t3 = constants::m_cbrt_one_ov_pi;
    constexpr double t5 = constants::m_cbrt_4;
    constexpr double t76 = constants::m_cbrt_2;
    constexpr double t6 = t5 * t5;
    constexpr double t13 = gamma_0;
    constexpr double t14 = beta1_0;
    constexpr double t19 = beta2_0 * t1;
    constexpr double t20 = t3 * t6;
    constexpr double t27 = a_0;
    constexpr double t32 = c_0 * t1;
    constexpr double t33 = t32 * t3;
    constexpr double t38 = d_0 * t1;
    constexpr double t43 = gamma_1;
    constexpr double t44 = beta1_1;
    constexpr double t48 = beta2_1 * t1;
    constexpr double t54 = a_1;
    constexpr double t58 = c_1 * t1;
    constexpr double t59 = t58 * t3;
    constexpr double t63 = d_1 * t1;


    const double t7 = safe_math::cbrt( rho );
    const double t8 = 0.1e1 / t7;
    const double t9 = t6 * t8;
    const double t10 = t1 * t3 * t9;
    const double t11 = t10 / 0.4e1;
    const double t12 = 0.1e1 <= t11;
    const double t15 = safe_math::sqrt( t10 );
    const double t21 = t20 * t8;
    const double t24 = 0.1e1 + t14 * t15 / 0.2e1 + t19 * t21 / 0.4e1;
    const double t28 = safe_math::log( t11 );
    const double t34 = t9 * t28;
    const double t42 = piecewise_functor_3( t12, t13 / t24, t27 * t28 + b_0 + t33 * t34 / 0.4e1 + t38 * t21 / 0.4e1 );
    const double t51 = 0.1e1 + t44 * t15 / 0.2e1 + t48 * t21 / 0.4e1;
    const double t67 = piecewise_functor_3( t12, t43 / t51, t54 * t28 + b_1 + t59 * t34 / 0.4e1 + t63 * t21 / 0.4e1 );
    const double t70 = safe_math::cbrt( zeta_tol );
    const double t72 = piecewise_functor_3( 0.1e1 <= zeta_tol, t70 * zeta_tol, 1.0 );
    const double t74 = 0.2e1 * t72 - 0.2e1;
    const double t79 = 0.1e1 / ( 0.2e1 * t76 - 0.2e1 );
    const double t80 = ( t67 - t42 ) * t74 * t79;
    const double t81 = t24 * t24;
    const double t83 = t13 / t81;
    const double t84 = 0.1e1 / t15;
    const double t86 = t14 * t84 * t1;
    const double t88 = 0.1e1 / t7 / rho;
    const double t89 = t20 * t88;
    const double t93 = -t19 * t89 / 0.12e2 - t86 * t89 / 0.12e2;
    const double t95 = 0.1e1 / rho;
    const double t99 = t6 * t88 * t28;
    const double t107 = piecewise_functor_3( t12, -t83 * t93, -t27 * t95 / 0.3e1 - t33 * t99 / 0.12e2 - t32 * t89 / 0.12e2 - t38 * t89 / 0.12e2 );
    const double t108 = t51 * t51;
    const double t110 = t43 / t108;
    const double t112 = t44 * t84 * t1;
    const double t116 = -t112 * t89 / 0.12e2 - t48 * t89 / 0.12e2;
    const double t127 = piecewise_functor_3( t12, -t110 * t116, -t54 * t95 / 0.3e1 - t59 * t99 / 0.12e2 - t58 * t89 / 0.12e2 - t63 * t89 / 0.12e2 );
    const double t130 = ( t127 - t107 ) * t74 * t79;


    eps = t42 + t80;
    vrho = t42 + t80 + rho * ( t107 + t130 );

  }